

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O1

void __thiscall SchnorrPubkey_FromPrivkey_Test::TestBody(SchnorrPubkey_FromPrivkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  bool parity;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  SchnorrPubkey actual_pubkey;
  bool local_71;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string local_60;
  string local_40;
  SchnorrPubkey local_20;
  
  local_71 = false;
  cfd::core::SchnorrPubkey::FromPrivkey(&local_20,&::sk,&local_71);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_60,&::pubkey);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_40,&local_20);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_70,"pubkey.GetHex()","actual_pubkey.GetHex()",&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_60._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
      local_60._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_60,"pubkey_parity","parity",&pubkey_parity,&local_71);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_40);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_40._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      }
      local_40._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SchnorrPubkey, FromPrivkey) {
  bool parity = false;
  auto actual_pubkey = SchnorrPubkey::FromPrivkey(sk, &parity);

  EXPECT_EQ(pubkey.GetHex(), actual_pubkey.GetHex());
  EXPECT_EQ(pubkey_parity, parity);
}